

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t mpidr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  _Bool secure;
  uint cur_el;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  iVar3 = arm_feature(env,0x20);
  if (((iVar3 == 0) || (_Var1)) || (iVar2 != 1)) {
    env_local = (CPUARMState_conflict *)mpidr_read_val(env);
  }
  else {
    env_local = (CPUARMState_conflict *)(env->cp15).vmpidr_el2;
  }
  return (uint64_t)env_local;
}

Assistant:

static uint64_t mpidr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vmpidr_el2;
    }
    return mpidr_read_val(env);
}